

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_interval_recorder.c
# Opt level: O2

int64_t hdr_interval_recorder_record_values_atomic
                  (hdr_interval_recorder *r,int64_t value,int64_t count)

{
  int64_t params [3];
  int64_t local_28;
  int64_t local_20;
  int64_t local_18;
  
  local_18 = 0;
  local_28 = value;
  local_20 = count;
  hdr_interval_recorder_update(r,update_values_atomic,&local_28);
  return local_18;
}

Assistant:

int64_t hdr_interval_recorder_record_values_atomic(
    struct hdr_interval_recorder* r,
    int64_t value,
    int64_t count
)
{
    int64_t params[3];
    params[0] = value;
    params[1] = count;
    params[2] = 0;

    hdr_interval_recorder_update(r, update_values_atomic, &params[0]);
    return params[2];
}